

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O3

float ggml_get_f32_1d(ggml_tensor *tensor,int i)

{
  ggml_type gVar1;
  char cVar2;
  int iVar3;
  float fVar4;
  int64_t id [4];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  
  cVar2 = ggml_is_contiguous();
  if (cVar2 == '\0') {
    local_38 = 0;
    uStack_30 = 0;
    uStack_28 = 0;
    uStack_20 = 0;
    ggml_unravel_index(tensor,(long)i,&local_38,&uStack_30,&uStack_28,&uStack_20);
    fVar4 = ggml_get_f32_nd(tensor,(int)local_38,(int)uStack_30,(int)uStack_28,(int)uStack_20);
    return fVar4;
  }
  gVar1 = tensor->type;
  switch(gVar1) {
  case GGML_TYPE_I8:
    iVar3 = (int)*(char *)((long)tensor->data + (long)i);
    goto LAB_0010ce95;
  case GGML_TYPE_I16:
    iVar3 = (int)*(short *)((long)tensor->data + (long)i * 2);
LAB_0010ce95:
    fVar4 = (float)iVar3;
    break;
  case GGML_TYPE_I32:
    fVar4 = (float)*(int *)((long)tensor->data + (long)i * 4);
    break;
  case GGML_TYPE_I64:
  case GGML_TYPE_F64:
  case GGML_TYPE_IQ1_M:
switchD_0010ce0b_caseD_1b:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
               ,0x432,"fatal error");
  case GGML_TYPE_BF16:
    fVar4 = (float)((uint)*(ushort *)((long)tensor->data + (long)i * 2) << 0x10);
    break;
  default:
    if (gVar1 == GGML_TYPE_F32) {
      fVar4 = *(float *)((long)tensor->data + (long)i * 4);
    }
    else {
      if (gVar1 != GGML_TYPE_F16) goto switchD_0010ce0b_caseD_1b;
      fVar4 = *(float *)(&ggml_table_f32_f16 +
                        (ulong)*(ushort *)((long)tensor->data + (long)i * 2) * 4);
    }
  }
  return fVar4;
}

Assistant:

float ggml_get_f32_1d(const struct ggml_tensor * tensor, int i) {
    if (!ggml_is_contiguous(tensor)) {
        int64_t id[4] = { 0, 0, 0, 0 };
        ggml_unravel_index(tensor, i, &id[0], &id[1], &id[2], &id[3]);
        return ggml_get_f32_nd(tensor, id[0], id[1], id[2], id[3]);
    }
    switch (tensor->type) {
        case GGML_TYPE_I8:
            {
                return ((int8_t *)(tensor->data))[i];
            }
        case GGML_TYPE_I16:
            {
                return ((int16_t *)(tensor->data))[i];
            }
        case GGML_TYPE_I32:
            {
                return ((int32_t *)(tensor->data))[i];
            }
        case GGML_TYPE_F16:
            {
                return GGML_FP16_TO_FP32(((ggml_fp16_t *)(tensor->data))[i]);
            }
        case GGML_TYPE_BF16:
            {
                return GGML_BF16_TO_FP32(((ggml_bf16_t *)(tensor->data))[i]);
            }
        case GGML_TYPE_F32:
            {
                return ((float *)(tensor->data))[i];
            }
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}